

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintInitClasses(Vec_Int_t *vInits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int Counts [6];
  
  Counts[0] = 0;
  Counts[1] = 0;
  Counts[2] = 0;
  Counts[3] = 0;
  Counts[4] = 0;
  Counts[5] = 0;
  for (iVar3 = 0; iVar3 < vInits->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vInits,iVar3);
    Counts[iVar1] = Counts[iVar1] + 1;
  }
  for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
    if (Counts[uVar4] != 0) {
      printf("%d = %d  ",uVar4 & 0xffffffff);
    }
  }
  iVar3 = 0;
  printf("  ");
  printf("B = %d  ",(ulong)(uint)(Counts[1] + Counts[0]));
  printf("X = %d  ",(ulong)(uint)(Counts[3] + Counts[2]));
  printf("Q = %d\n",(ulong)(uint)(Counts[5] + Counts[4]));
  while( true ) {
    if (vInits->nSize <= iVar3) {
      putchar(10);
      return;
    }
    uVar2 = Vec_IntEntry(vInits,iVar3);
    Counts[(int)uVar2] = Counts[(int)uVar2] + 1;
    if (5 < uVar2) break;
    putchar(uVar2 | 0x30);
    iVar3 = iVar3 + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                ,0x17f,"void Gia_ManPrintInitClasses(Vec_Int_t *)");
}

Assistant:

void Gia_ManPrintInitClasses( Vec_Int_t * vInits )
{
    int i, Value;
    int Counts[6] = {0};
    Vec_IntForEachEntry( vInits, Value, i )
        Counts[Value]++;
    for ( i = 0; i < 6; i++ )
        if ( Counts[i] )
            printf( "%d = %d  ", i, Counts[i] );
    printf( "  " );
    printf( "B = %d  ", Counts[0] + Counts[1] );
    printf( "X = %d  ", Counts[2] + Counts[3] );
    printf( "Q = %d\n", Counts[4] + Counts[5] );
    Vec_IntForEachEntry( vInits, Value, i )
    {
        Counts[Value]++;
        if ( Value == 0 )
            printf( "0" );
        else if ( Value == 1 )
            printf( "1" );
        else if ( Value == 2 )
            printf( "2" );
        else if ( Value == 3 )
            printf( "3" );
        else if ( Value == 4 )
            printf( "4" );
        else if ( Value == 5 )
            printf( "5" );
        else assert( 0 );
    }
    printf( "\n" );
    
}